

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  RepeatedField<int> *pRVar1;
  uint uVar2;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar3;
  uint uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  size_t sVar6;
  void **ppvVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x10);
  uVar14 = (ulong)uVar2;
  uVar4 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
    uVar13 = 0;
  }
  for (; uVar4 != uVar13; uVar13 = uVar13 + 1) {
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase,uVar13);
    sVar6 = internal::WireFormatLite::StringSize(pVVar5);
    uVar14 = uVar14 + sVar6;
  }
  lVar15 = uVar14 + (long)*(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.message_type_;
  ppvVar7 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar8 = RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  for (; ppvVar7 != cVar8.it_; ppvVar7 = ppvVar7 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      ((DescriptorProto *)*ppvVar7);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.enum_type_;
  ppvVar7 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  cVar9 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_01);
  for (; ppvVar7 != cVar9.it_; ppvVar7 = ppvVar7 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      ((EnumDescriptorProto *)*ppvVar7);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x58);
  this_02 = &(this->field_0)._impl_.service_;
  ppvVar7 = internal::RepeatedPtrFieldBase::elements(&this_02->super_RepeatedPtrFieldBase);
  cVar10 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(this_02);
  for (; ppvVar7 != cVar10.it_; ppvVar7 = ppvVar7 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceDescriptorProto>
                      ((ServiceDescriptorProto *)*ppvVar7);
    lVar15 = lVar15 + sVar6;
  }
  lVar15 = lVar15 + *(int *)((long)&this->field_0 + 0x70);
  this_03 = &(this->field_0)._impl_.extension_;
  ppvVar7 = internal::RepeatedPtrFieldBase::elements(&this_03->super_RepeatedPtrFieldBase);
  cVar11 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_03);
  for (; ppvVar7 != cVar11.it_; ppvVar7 = ppvVar7 + 1) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)*ppvVar7);
    lVar15 = lVar15 + sVar6;
  }
  pRVar1 = &(this->field_0)._impl_.public_dependency_;
  sVar6 = internal::WireFormatLite::Int32Size(pRVar1);
  uVar4 = RepeatedField<int>::size(pRVar1);
  pRVar1 = &(this->field_0)._impl_.weak_dependency_;
  sVar12 = internal::WireFormatLite::Int32Size(pRVar1);
  uVar13 = RepeatedField<int>::size(pRVar1);
  uVar2 = *(uint *)((long)&this->field_0 + 0xa8);
  sVar6 = uVar13 + sVar12 + sVar6 + lVar15 + (ulong)uVar4 + (ulong)uVar2;
  uVar4 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
    uVar13 = 0;
  }
  for (; uVar4 != uVar13; uVar13 = uVar13 + 1) {
    pVVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.option_dependency_.super_RepeatedPtrFieldBase,uVar13
                       );
    sVar12 = internal::WireFormatLite::StringSize(pVVar5);
    sVar6 = sVar6 + sVar12;
  }
  aVar3 = this->field_0;
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x3f) != (undefined1  [232])0x0) {
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x1) != (undefined1  [232])0x0) {
      sVar12 = internal::WireFormatLite::StringSize
                         ((string *)
                          ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                          ));
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x2) != (undefined1  [232])0x0) {
      sVar12 = internal::WireFormatLite::StringSize
                         ((string *)
                          ((ulong)(this->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc));
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
      sVar12 = internal::WireFormatLite::StringSize
                         ((string *)
                          ((ulong)(this->field_0)._impl_.syntax_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc));
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
      sVar12 = internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>
                         ((this->field_0)._impl_.options_);
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
      sVar12 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo>
                         ((this->field_0)._impl_.source_code_info_);
      sVar6 = sVar6 + sVar12 + 1;
    }
    if (((undefined1  [232])aVar3 & (undefined1  [232])0x20) != (undefined1  [232])0x0) {
      uVar14 = (long)(this->field_0)._impl_.edition_ | 1;
      lVar15 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar15 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t FileDescriptorProto::ByteSizeLong() const {
  const FileDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string dependency = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_dependency().size());
      for (int i = 0, n = this_._internal_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_dependency().Get(i));
      }
    }
    // repeated .google.protobuf.DescriptorProto message_type = 4;
    {
      total_size += 1UL * this_._internal_message_type_size();
      for (const auto& msg : this_._internal_message_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
    {
      total_size += 1UL * this_._internal_enum_type_size();
      for (const auto& msg : this_._internal_enum_type()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.ServiceDescriptorProto service = 6;
    {
      total_size += 1UL * this_._internal_service_size();
      for (const auto& msg : this_._internal_service()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FieldDescriptorProto extension = 7;
    {
      total_size += 1UL * this_._internal_extension_size();
      for (const auto& msg : this_._internal_extension()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated int32 public_dependency = 10;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_public_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_public_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 weak_dependency = 11;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_weak_dependency());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_weak_dependency_size());
      total_size += tag_size + data_size;
    }
    // repeated string option_dependency = 15;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_option_dependency().size());
      for (int i = 0, n = this_._internal_option_dependency().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_option_dependency().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string package = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_package());
    }
    // optional string syntax = 12;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_syntax());
    }
    // optional .google.protobuf.FileOptions options = 8;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.source_code_info_);
    }
    // optional .google.protobuf.Edition edition = 14;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}